

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

pair<std::_List_iterator<Item>,_bool> __thiscall State::insertClosure(State *this,Item *item)

{
  _List_iterator<Item> __position;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  ItemList *this_00;
  pair<std::_List_iterator<Item>,_bool> pVar2;
  
  this_00 = &this->closure;
  __position = std::
               __find_if<std::_List_iterator<Item>,__gnu_cxx::__ops::_Iter_equals_val<Item_const>>
                         ((this->closure).super__List_base<Item,_std::allocator<Item>_>._M_impl.
                          _M_node.super__List_node_base._M_next,this_00,item);
  if (__position._M_node == (_List_node_base *)this_00) {
    __position._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::insert(this_00,__position._M_node,item);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first._M_node = __position._M_node;
  return pVar2;
}

Assistant:

std::pair<ItemPointer, bool> State::insertClosure(const Item &item)
{
  ItemPointer it = std::find (closure.begin (), closure.end (), item);

  if (it != closure.end ())
    return {it, false};

  return {closure.insert (it, item), true};
}